

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.cpp
# Opt level: O1

bool __thiscall
duckdb::TryMultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
          (TryMultiplyOperator *this,interval_t left,double right,interval_t *result)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  int iVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 in_XMM3_Qb;
  double d;
  double local_40;
  undefined1 local_38 [16];
  double local_28;
  
  piVar5 = (int *)left.micros;
  dVar1 = (double)(int)this * right;
  bVar4 = false;
  if ((dVar1 <= 2147483647.0) && (bVar4 = false, -2147483648.0 <= dVar1)) {
    *piVar5 = (int)dVar1;
    local_40 = (double)(int)((ulong)this >> 0x20) * right;
    bVar4 = false;
    if ((local_40 <= 2147483647.0) && (-2147483648.0 <= local_40)) {
      iVar6 = (int)local_40;
      piVar5[1] = iVar6;
      local_38._8_8_ = in_XMM3_Qb;
      local_38._0_8_ = local_40;
      local_28 = right;
      dVar1 = nearbyint((dVar1 - (double)(int)dVar1) * 30.0 * 1000000.0);
      dVar1 = dVar1 / 1000000.0;
      dVar2 = nearbyint(((((double)local_38._0_8_ - (double)(int)(double)local_38._0_8_) + dVar1) -
                        (double)(int)dVar1) * 86400.0 * 1000000.0);
      dVar2 = dVar2 / 1000000.0;
      if (86400.0 <= ABS(dVar2)) {
        piVar5[1] = iVar6 + (int)(dVar2 / 86400.0);
        dVar2 = dVar2 - (double)((int)(dVar2 / 86400.0) * 0x15180);
      }
      local_38._8_4_ = extraout_XMM0_Dc;
      local_38._0_8_ = dVar2;
      local_38._12_4_ = extraout_XMM0_Dd;
      piVar5[1] = piVar5[1] + (int)dVar1;
      bVar4 = false;
      bVar3 = TryCast::Operation<long,double>(left._0_8_,&local_40,false);
      if (bVar3) {
        local_40 = nearbyint(local_28 * local_40 + (double)local_38._0_8_ * 1000000.0);
        if (NAN(local_40)) {
          bVar4 = false;
        }
        else {
          bVar4 = TryCast::Operation<double,long>(local_40,(int64_t *)(piVar5 + 2),false);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool TryMultiplyOperator::Operation(interval_t left, double right, interval_t &result) {
	double d = left.months * right;
	if (std::isnan(d) || d < NumericLimits<int32_t>::Minimum() || d > NumericLimits<int32_t>::Maximum()) {
		return false;
	}
	result.months = LossyNumericCast<int32_t>(d);

	d = left.days * right;
	if (std::isnan(d) || d < NumericLimits<int32_t>::Minimum() || d > NumericLimits<int32_t>::Maximum()) {
		return false;
	}
	result.days = LossyNumericCast<int32_t>(d);

	/*
	 * The above correctly handles the whole-number part of the month and day
	 * products, but we have to do something with any fractional part
	 * resulting when the factor is non-integral.  We cascade the fractions
	 * down to lower units using the conversion factors DAYS_PER_MONTH and
	 * SECS_PER_DAY.  Note we do NOT cascade up, since we are not forced to do
	 * so by the representation.  The user can choose to cascade up later,
	 * using justify_hours and/or justify_days.
	 */

	/*
	 * Fractional months full days into days.
	 *
	 * Floating point calculation are inherently imprecise, so these
	 * calculations are crafted to produce the most reliable result possible.
	 * TSROUND() is needed to more accurately produce whole numbers where
	 * appropriate.
	 */
	double month_remainder = (left.months * right - result.months) * Interval::DAYS_PER_MONTH;
	month_remainder = PGTimestampRound(month_remainder);
	auto day_remainder = LossyNumericCast<int32_t>(month_remainder);

	double sec_remainder = (left.days * right - result.days + month_remainder - day_remainder) * Interval::SECS_PER_DAY;
	sec_remainder = PGTimestampRound(sec_remainder);

	/*
	 * Might have 24:00:00 hours due to rounding, or >24 hours because of time
	 * cascade from months and days.  It might still be >24 if the combination
	 * of cascade and the seconds factor operation itself.
	 */
	if (std::fabs(sec_remainder) >= Interval::SECS_PER_DAY) {
		result.days += LossyNumericCast<int32_t>(sec_remainder / Interval::SECS_PER_DAY);
		sec_remainder -= LossyNumericCast<int32_t>(sec_remainder / Interval::SECS_PER_DAY) * Interval::SECS_PER_DAY;
	}

	/* cascade units down */
	result.days += day_remainder;
	if (!TryCast::Operation<int64_t, double>(left.micros, d)) {
		return false;
	}
	d = std::nearbyint(d * right + sec_remainder * Interval::MICROS_PER_SEC);
	if (std::isnan(d) || !TryCast::Operation<double, int64_t>(d, result.micros)) {
		return false;
	}

	return true;
}